

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_16x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  int left_offset;
  ulong uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  ushort uVar29;
  short sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 auVar35 [16];
  short sVar50;
  short sVar53;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ushort uVar54;
  short sVar55;
  ushort uVar56;
  ushort uVar57;
  short sVar59;
  ushort uVar60;
  ushort uVar61;
  short sVar62;
  ushort uVar63;
  ushort uVar64;
  short sVar65;
  ushort uVar66;
  ushort uVar67;
  short sVar68;
  ushort uVar69;
  ushort uVar70;
  short sVar71;
  ushort uVar72;
  ushort uVar73;
  short sVar74;
  ushort uVar75;
  ushort uVar76;
  undefined1 auVar58 [16];
  short sVar77;
  ushort uVar78;
  ushort uVar79;
  
  auVar28 = pshuflw(ZEXT116(left_column[0x3f]),ZEXT116(left_column[0x3f]),0);
  auVar1 = *(undefined1 (*) [16])top_row;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar1._0_13_;
  auVar2[0xe] = auVar1[7];
  auVar4[0xc] = auVar1[6];
  auVar4._0_12_ = auVar1._0_12_;
  auVar4._13_2_ = auVar2._13_2_;
  auVar6[0xb] = 0;
  auVar6._0_11_ = auVar1._0_11_;
  auVar6._12_3_ = auVar4._12_3_;
  auVar8[10] = auVar1[5];
  auVar8._0_10_ = auVar1._0_10_;
  auVar8._11_4_ = auVar6._11_4_;
  auVar10[9] = 0;
  auVar10._0_9_ = auVar1._0_9_;
  auVar10._10_5_ = auVar8._10_5_;
  auVar12[8] = auVar1[4];
  auVar12._0_8_ = auVar1._0_8_;
  auVar12._9_6_ = auVar10._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar12._8_7_;
  Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),auVar1[3]);
  auVar22._9_6_ = 0;
  auVar22._0_9_ = Var17;
  auVar18._1_10_ = SUB1510(auVar22 << 0x30,5);
  auVar18[0] = auVar1[2];
  auVar23._11_4_ = 0;
  auVar23._0_11_ = auVar18;
  auVar14[2] = auVar1[1];
  auVar14._0_2_ = auVar1._0_2_;
  auVar14._3_12_ = SUB1512(auVar23 << 0x20,3);
  uVar29 = auVar1._0_2_ & 0xff;
  for (uVar26 = 0; uVar26 < 0x40; uVar26 = uVar26 + 0x10) {
    auVar52 = *(undefined1 (*) [16])(smooth_weights + uVar26 + 0x3c);
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar52._0_13_;
    auVar3[0xe] = auVar52[7];
    auVar5[0xc] = auVar52[6];
    auVar5._0_12_ = auVar52._0_12_;
    auVar5._13_2_ = auVar3._13_2_;
    auVar7[0xb] = 0;
    auVar7._0_11_ = auVar52._0_11_;
    auVar7._12_3_ = auVar5._12_3_;
    auVar9[10] = auVar52[5];
    auVar9._0_10_ = auVar52._0_10_;
    auVar9._11_4_ = auVar7._11_4_;
    auVar11[9] = 0;
    auVar11._0_9_ = auVar52._0_9_;
    auVar11._10_5_ = auVar9._10_5_;
    auVar13[8] = auVar52[4];
    auVar13._0_8_ = auVar52._0_8_;
    auVar13._9_6_ = auVar11._9_6_;
    auVar19._7_8_ = 0;
    auVar19._0_7_ = auVar13._8_7_;
    Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),auVar52[3]);
    auVar24._9_6_ = 0;
    auVar24._0_9_ = Var20;
    auVar21._1_10_ = SUB1510(auVar24 << 0x30,5);
    auVar21[0] = auVar52[2];
    auVar25._11_4_ = 0;
    auVar25._0_11_ = auVar21;
    auVar15[2] = auVar52[1];
    auVar15._0_2_ = auVar52._0_2_;
    auVar15._3_12_ = SUB1512(auVar25 << 0x20,3);
    auVar35._0_2_ = auVar52._0_2_ & 0xff;
    auVar35._2_13_ = auVar15._2_13_;
    auVar35[0xf] = 0;
    auVar31._0_2_ = CONCAT11(0,auVar52[8]);
    auVar31[2] = auVar52[9];
    auVar31[3] = 0;
    auVar31[4] = auVar52[10];
    auVar31[5] = 0;
    auVar31[6] = auVar52[0xb];
    auVar31[7] = 0;
    auVar31[8] = auVar52[0xc];
    auVar31[9] = 0;
    auVar31[10] = auVar52[0xd];
    auVar31[0xb] = 0;
    auVar31[0xc] = auVar52[0xe];
    auVar31[0xd] = 0;
    auVar31[0xe] = auVar52[0xf];
    auVar31[0xf] = 0;
    sVar50 = auVar28._0_2_;
    auVar32._0_2_ = (0x100 - auVar35._0_2_) * sVar50;
    sVar53 = auVar28._2_2_;
    auVar32._2_2_ = (0x100 - auVar15._2_2_) * sVar53;
    auVar32._4_2_ = (0x100 - auVar21._0_2_) * sVar50;
    auVar32._6_2_ = (0x100 - (short)Var20) * sVar53;
    auVar32._8_2_ = (0x100 - auVar13._8_2_) * sVar50;
    auVar32._10_2_ = (0x100 - auVar9._10_2_) * sVar53;
    auVar32._12_2_ = (0x100 - auVar5._12_2_) * sVar50;
    auVar32._14_2_ = (0x100 - (auVar3._13_2_ >> 8)) * sVar53;
    uVar27 = 0x1000100;
    while( true ) {
      sVar30 = (short)Var17;
      uVar34 = auVar2._13_2_ >> 8;
      if (0xf0e0f0e < uVar27) break;
      auVar58._4_4_ = uVar27;
      auVar58._0_4_ = uVar27;
      auVar58._8_4_ = uVar27;
      auVar58._12_4_ = uVar27;
      auVar51 = pshufb(auVar35,auVar58);
      auVar58 = pshufb(auVar32,auVar58);
      sVar55 = auVar58._0_2_ + 0x80;
      sVar59 = auVar58._2_2_ + 0x80;
      sVar62 = auVar58._4_2_ + 0x80;
      sVar65 = auVar58._6_2_ + 0x80;
      sVar68 = auVar58._8_2_ + 0x80;
      sVar71 = auVar58._10_2_ + 0x80;
      sVar74 = auVar58._12_2_ + 0x80;
      sVar77 = auVar58._14_2_ + 0x80;
      uVar33 = auVar51._0_2_ * uVar29 + sVar55;
      uVar36 = auVar51._2_2_ * auVar14._2_2_ + sVar59;
      uVar38 = auVar51._4_2_ * auVar18._0_2_ + sVar62;
      uVar40 = auVar51._6_2_ * sVar30 + sVar65;
      uVar42 = auVar51._8_2_ * auVar12._8_2_ + sVar68;
      uVar44 = auVar51._10_2_ * auVar8._10_2_ + sVar71;
      uVar46 = auVar51._12_2_ * auVar4._12_2_ + sVar74;
      uVar48 = auVar51._14_2_ * uVar34 + sVar77;
      uVar34 = uVar33 >> 8;
      uVar37 = uVar36 >> 8;
      uVar39 = uVar38 >> 8;
      uVar41 = uVar40 >> 8;
      uVar43 = uVar42 >> 8;
      uVar45 = uVar44 >> 8;
      uVar47 = uVar46 >> 8;
      uVar49 = uVar48 >> 8;
      uVar56 = sVar55 + auVar51._0_2_ * (ushort)auVar1[8];
      uVar60 = sVar59 + auVar51._2_2_ * (ushort)auVar1[9];
      uVar63 = sVar62 + auVar51._4_2_ * (ushort)auVar1[10];
      uVar66 = sVar65 + auVar51._6_2_ * (ushort)auVar1[0xb];
      uVar69 = sVar68 + auVar51._8_2_ * (ushort)auVar1[0xc];
      uVar72 = sVar71 + auVar51._10_2_ * (ushort)auVar1[0xd];
      uVar75 = sVar74 + auVar51._12_2_ * (ushort)auVar1[0xe];
      uVar78 = sVar77 + auVar51._14_2_ * (ushort)auVar1[0xf];
      uVar57 = uVar56 >> 8;
      uVar61 = uVar60 >> 8;
      uVar64 = uVar63 >> 8;
      uVar67 = uVar66 >> 8;
      uVar70 = uVar69 >> 8;
      uVar73 = uVar72 >> 8;
      uVar76 = uVar75 >> 8;
      uVar79 = uVar78 >> 8;
      *dst = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
      dst[1] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
      dst[2] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39);
      dst[3] = (uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41);
      dst[4] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[5] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[6] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
      dst[7] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[8] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
      dst[9] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
      dst[10] = (uVar64 != 0) * (uVar64 < 0x100) * (char)(uVar63 >> 8) - (0xff < uVar64);
      dst[0xb] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
      dst[0xc] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
      dst[0xd] = (uVar73 != 0) * (uVar73 < 0x100) * (char)(uVar72 >> 8) - (0xff < uVar73);
      dst[0xe] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
      dst[0xf] = (uVar79 != 0) * (uVar79 < 0x100) * (char)(uVar78 >> 8) - (0xff < uVar79);
      dst = dst + stride;
      uVar27 = uVar27 + 0x2020202;
    }
    auVar51._0_2_ = (0x100 - auVar31._0_2_) * sVar50;
    auVar51._2_2_ = (0x100 - (ushort)auVar52[9]) * sVar53;
    auVar51._4_2_ = (0x100 - (ushort)auVar52[10]) * sVar50;
    auVar51._6_2_ = (0x100 - (ushort)auVar52[0xb]) * sVar53;
    auVar51._8_2_ = (0x100 - (ushort)auVar52[0xc]) * sVar50;
    auVar51._10_2_ = (0x100 - (ushort)auVar52[0xd]) * sVar53;
    auVar51._12_2_ = (0x100 - (ushort)auVar52[0xe]) * sVar50;
    auVar51._14_2_ = (0x100 - (ushort)auVar52[0xf]) * sVar53;
    for (uVar27 = 0x1000100; uVar27 < 0xf0e0f0f; uVar27 = uVar27 + 0x2020202) {
      auVar52._4_4_ = uVar27;
      auVar52._0_4_ = uVar27;
      auVar52._8_4_ = uVar27;
      auVar52._12_4_ = uVar27;
      auVar35 = pshufb(auVar31,auVar52);
      auVar52 = pshufb(auVar51,auVar52);
      sVar50 = auVar52._0_2_ + 0x80;
      sVar53 = auVar52._2_2_ + 0x80;
      sVar55 = auVar52._4_2_ + 0x80;
      sVar59 = auVar52._6_2_ + 0x80;
      sVar62 = auVar52._8_2_ + 0x80;
      sVar65 = auVar52._10_2_ + 0x80;
      sVar68 = auVar52._12_2_ + 0x80;
      sVar71 = auVar52._14_2_ + 0x80;
      uVar33 = auVar35._0_2_ * uVar29 + sVar50;
      uVar37 = auVar35._2_2_ * auVar14._2_2_ + sVar53;
      uVar39 = auVar35._4_2_ * auVar18._0_2_ + sVar55;
      uVar41 = auVar35._6_2_ * sVar30 + sVar59;
      uVar43 = auVar35._8_2_ * auVar12._8_2_ + sVar62;
      uVar45 = auVar35._10_2_ * auVar8._10_2_ + sVar65;
      uVar47 = auVar35._12_2_ * auVar4._12_2_ + sVar68;
      uVar49 = auVar35._14_2_ * uVar34 + sVar71;
      uVar36 = uVar33 >> 8;
      uVar38 = uVar37 >> 8;
      uVar40 = uVar39 >> 8;
      uVar42 = uVar41 >> 8;
      uVar44 = uVar43 >> 8;
      uVar46 = uVar45 >> 8;
      uVar48 = uVar47 >> 8;
      uVar56 = uVar49 >> 8;
      uVar57 = sVar50 + auVar35._0_2_ * (ushort)auVar1[8];
      uVar61 = sVar53 + auVar35._2_2_ * (ushort)auVar1[9];
      uVar64 = sVar55 + auVar35._4_2_ * (ushort)auVar1[10];
      uVar67 = sVar59 + auVar35._6_2_ * (ushort)auVar1[0xb];
      uVar70 = sVar62 + auVar35._8_2_ * (ushort)auVar1[0xc];
      uVar73 = sVar65 + auVar35._10_2_ * (ushort)auVar1[0xd];
      uVar76 = sVar68 + auVar35._12_2_ * (ushort)auVar1[0xe];
      uVar79 = sVar71 + auVar35._14_2_ * (ushort)auVar1[0xf];
      uVar60 = uVar57 >> 8;
      uVar63 = uVar61 >> 8;
      uVar66 = uVar64 >> 8;
      uVar69 = uVar67 >> 8;
      uVar72 = uVar70 >> 8;
      uVar75 = uVar73 >> 8;
      uVar78 = uVar76 >> 8;
      uVar54 = uVar79 >> 8;
      *dst = (uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar36);
      dst[1] = (uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) - (0xff < uVar38);
      dst[2] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      dst[3] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42);
      dst[4] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
      dst[5] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
      dst[6] = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
      dst[7] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar56);
      dst[8] = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar60);
      dst[9] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar63);
      dst[10] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar66);
      dst[0xb] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar69);
      dst[0xc] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar72);
      dst[0xd] = (uVar75 != 0) * (uVar75 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar75);
      dst[0xe] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar76 >> 8) - (0xff < uVar78);
      dst[0xf] = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar54);
      dst = dst + stride;
    }
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_16x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[63]);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = _mm_unpackhi_epi8(top, zero);
  const uint8_t *weights_base_ptr = smooth_weights + 60;
  for (int left_offset = 0; left_offset < 64; left_offset += 16) {
    const __m128i weights = LoadUnaligned16(weights_base_ptr + left_offset);
    const __m128i weights_lo = cvtepu8_epi16(weights);
    const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
    const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
    const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
    const __m128i scaled_bottom_left_lo =
        _mm_mullo_epi16(inverted_weights_lo, bottom_left);
    const __m128i scaled_bottom_left_hi =
        _mm_mullo_epi16(inverted_weights_hi, bottom_left);

    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
      write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
      const __m128i scaled_bottom_left_y =
          _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
      write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                     scaled_bottom_left_y, scaled_bottom_left_y,
                                     round);
      dst += stride;
    }
  }
}